

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

size_t __thiscall DROPlayer::DeviceID2OptionID(DROPlayer *this,UINT32 id)

{
  size_type sVar1;
  byte *pbVar2;
  byte local_1e;
  byte local_1d;
  UINT8 instance;
  UINT8 type;
  UINT32 id_local;
  DROPlayer *this_local;
  
  if ((id & 0x80000000) == 0) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_devTypes);
    if (sVar1 <= id) {
      return 0xffffffffffffffff;
    }
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_devTypes,(ulong)id);
    local_1d = *pbVar2;
    local_1e = (byte)id;
  }
  else {
    local_1e = (byte)(id >> 0x10);
    local_1d = (byte)id;
  }
  if (local_1d == 9) {
    if (local_1e < 2) {
      return (long)(int)(uint)local_1e;
    }
  }
  else if ((local_1d == 0xc) && (local_1e == 0)) {
    return 2;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t DROPlayer::DeviceID2OptionID(UINT32 id) const
{
	UINT8 type;
	UINT8 instance;
	
	if (id & 0x80000000)
	{
		type = (id >> 0) & 0xFF;
		instance = (id >> 16) & 0xFF;
	}
	else if (id < _devTypes.size())
	{
		type = _devTypes[id];
		instance = (UINT8)id;
	}
	else
	{
		return (size_t)-1;
	}
	
	if (type == DEVID_YM3812)
	{
		if (instance < 2)
			return 0 + instance;
	}
	else if (type == DEVID_YMF262)
	{
		if (instance < 1)
			return 2 + instance;
	}
	return (size_t)-1;
}